

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStepInnerStepper_EvolveSUNStepper
              (MRIStepInnerStepper stepper,sunrealtype t0,sunrealtype tout,N_Vector y)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  sunrealtype tret;
  undefined1 local_28 [8];
  
  pvVar1 = stepper->content;
  iVar2 = SUNStepper_SetForcing
                    (stepper->tshift,stepper->tscale,pvVar1,stepper->forcing,stepper->nforcing);
  stepper->last_flag = *(int *)((long)pvVar1 + 0x18);
  iVar3 = -0x33;
  if (iVar2 == 0) {
    iVar2 = SUNStepper_SetStopTime(tout,pvVar1);
    stepper->last_flag = *(int *)((long)pvVar1 + 0x18);
    if (iVar2 == 0) {
      iVar2 = SUNStepper_Evolve(tout,pvVar1,y,local_28);
      stepper->last_flag = *(int *)((long)pvVar1 + 0x18);
      if (iVar2 == 0) {
        iVar2 = SUNStepper_SetForcing(0,0x3ff0000000000000,pvVar1,0,0);
        stepper->last_flag = *(int *)((long)pvVar1 + 0x18);
        iVar3 = -0x33;
        if (iVar2 == 0) {
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mriStepInnerStepper_EvolveSUNStepper(MRIStepInnerStepper stepper,
                                         SUNDIALS_MAYBE_UNUSED sunrealtype t0,
                                         sunrealtype tout, N_Vector y)
{
  SUNStepper sunstepper = (SUNStepper)stepper->content;
  sunrealtype tret;

  SUNErrCode err     = SUNStepper_SetForcing(sunstepper, stepper->tshift,
                                             stepper->tscale, stepper->forcing,
                                             stepper->nforcing);
  stepper->last_flag = sunstepper->last_flag;
  if (err != SUN_SUCCESS) { return ARK_SUNSTEPPER_ERR; }

  err                = SUNStepper_SetStopTime(sunstepper, tout);
  stepper->last_flag = sunstepper->last_flag;
  if (err != SUN_SUCCESS) { return ARK_SUNSTEPPER_ERR; }

  err                = SUNStepper_Evolve(sunstepper, tout, y, &tret);
  stepper->last_flag = sunstepper->last_flag;
  if (err != SUN_SUCCESS) { return ARK_SUNSTEPPER_ERR; }

  err                = SUNStepper_SetForcing(sunstepper, ZERO, ONE, NULL, 0);
  stepper->last_flag = sunstepper->last_flag;
  if (err != SUN_SUCCESS) { return ARK_SUNSTEPPER_ERR; }

  return ARK_SUCCESS;
}